

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O2

string * __thiscall
LatencyDumpDefaultImpl::ratioToPercent_abi_cxx11_
          (string *__return_storage_ptr__,LatencyDumpDefaultImpl *this,uint64_t a,uint64_t b)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  auVar2._8_4_ = (int)((ulong)this >> 0x20);
  auVar2._0_8_ = this;
  auVar2._12_4_ = 0x45300000;
  auVar3._8_4_ = (int)(a >> 0x20);
  auVar3._0_8_ = a;
  auVar3._12_4_ = 0x45300000;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 1;
  poVar1 = std::ostream::_M_insert<double>
                     ((((auVar2._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) * 100.0) /
                      ((auVar3._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)a) - 4503599627370496.0)));
  std::operator<<(poVar1," %");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string ratioToPercent(uint64_t a, uint64_t b) {
        std::stringstream ss;
        double tmp = (double)100.0 * a / b;
        ss << std::fixed << std::setprecision(1) << tmp << " %";
        return ss.str();
    }